

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_uint64 drwav_write_pcm_frames_be(drwav *pWav,drwav_uint64 framesToWrite,void *pData)

{
  ushort *puVar1;
  undefined1 uVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 *puVar10;
  size_t sVar11;
  anon_union_8_2_947300a4 x;
  ulong uVar12;
  ulong __n;
  long lVar13;
  drwav_uint8 temp [4096];
  undefined8 local_1038;
  
  if (pData == (void *)0x0 || (framesToWrite == 0 || pWav == (drwav *)0x0)) {
    return 0;
  }
  uVar3 = pWav->bitsPerSample;
  if ((uVar3 & 7) == 0) {
    uVar8 = (uint)(pWav->fmt).channels * (uint)uVar3 >> 3;
  }
  else {
    uVar8 = (uint)(pWav->fmt).blockAlign;
  }
  uVar12 = (ulong)uVar3 * framesToWrite * pWav->channels >> 3;
  lVar13 = 0;
  uVar6 = (ulong)uVar8 / (ulong)pWav->channels;
  do {
    if (uVar12 == 0) break;
    uVar7 = 0x1000 / uVar6;
    __n = uVar7 * uVar6;
    if (uVar12 < uVar7 * uVar6) {
      __n = uVar12;
    }
    memcpy(&local_1038,pData,__n);
    uVar3 = pWav->translatedFormatTag;
    uVar8 = (uint)uVar6;
    if (uVar3 - 6 < 2) {
      if (uVar8 < 0x1001) {
        uVar9 = 0;
        do {
          puVar1 = (ushort *)((long)&local_1038 + uVar9 * 2);
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
          uVar9 = uVar9 + 1;
        } while (uVar9 < uVar7);
      }
    }
    else if (uVar3 == 3) {
      if (uVar6 == 4) {
        if (uVar8 < 0x1001) {
          uVar9 = 0;
          do {
            uVar4 = *(uint *)((long)&local_1038 + uVar9 * 4);
            *(uint *)((long)&local_1038 + uVar9 * 4) =
                 uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
            uVar9 = uVar9 + 1;
          } while (uVar9 < uVar7);
        }
      }
      else if (uVar8 == 8) {
        uVar9 = 0;
        do {
          uVar5 = (&local_1038)[uVar9];
          (&local_1038)[uVar9] =
               uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18
               | (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 |
               (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
          uVar9 = uVar9 + 1;
        } while (uVar9 < uVar7);
      }
    }
    else if (uVar3 == 1) {
      if (uVar6 == 2) {
        if (uVar8 < 0x1001) {
          uVar9 = 0;
          do {
            puVar1 = (ushort *)((long)&local_1038 + uVar9 * 2);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            uVar9 = uVar9 + 1;
          } while (uVar9 < uVar7);
        }
      }
      else if (uVar8 == 3) {
        puVar10 = (undefined1 *)((long)&local_1038 + 2);
        uVar9 = 0;
        do {
          uVar2 = puVar10[-2];
          puVar10[-2] = *puVar10;
          *puVar10 = uVar2;
          uVar9 = uVar9 + 1;
          puVar10 = puVar10 + 3;
        } while (uVar9 < uVar7);
      }
      else if (uVar8 == 4) {
        uVar9 = 0;
        do {
          uVar4 = *(uint *)((long)&local_1038 + uVar9 * 4);
          *(uint *)((long)&local_1038 + uVar9 * 4) =
               uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
          uVar9 = uVar9 + 1;
        } while (uVar9 < uVar7);
      }
    }
    if (uVar8 < 0x1001) {
      sVar11 = (*pWav->onWrite)(pWav->pUserData,&local_1038,__n);
      pWav->dataChunkDataSize = pWav->dataChunkDataSize + sVar11;
    }
    else {
      sVar11 = 0;
    }
    uVar12 = uVar12 - sVar11;
    lVar13 = lVar13 + sVar11;
    pData = (void *)((long)pData + sVar11);
  } while (sVar11 != 0);
  return ((ulong)(lVar13 << 3) / (ulong)pWav->bitsPerSample) / (ulong)pWav->channels;
}

Assistant:

DRWAV_API drwav_uint64 drwav_write_pcm_frames_be(drwav* pWav, drwav_uint64 framesToWrite, const void* pData)
{
    drwav_uint64 bytesToWrite;
    drwav_uint64 bytesWritten;
    drwav_uint32 bytesPerSample;
    const drwav_uint8* pRunningData;

    if (pWav == NULL || framesToWrite == 0 || pData == NULL) {
        return 0;
    }

    bytesToWrite = ((framesToWrite * pWav->channels * pWav->bitsPerSample) / 8);
    if (bytesToWrite > DRWAV_SIZE_MAX) {
        return 0;
    }

    bytesWritten = 0;
    pRunningData = (const drwav_uint8*)pData;

    bytesPerSample = drwav_get_bytes_per_pcm_frame(pWav) / pWav->channels;
    
    while (bytesToWrite > 0) {
        drwav_uint8 temp[4096];
        drwav_uint32 sampleCount;
        size_t bytesJustWritten;
        drwav_uint64 bytesToWriteThisIteration;

        bytesToWriteThisIteration = bytesToWrite;
        DRWAV_ASSERT(bytesToWriteThisIteration <= DRWAV_SIZE_MAX);  /* <-- This is checked above. */

        /*
        WAV files are always little-endian. We need to byte swap on big-endian architectures. Since our input buffer is read-only we need
        to use an intermediary buffer for the conversion.
        */
        sampleCount = sizeof(temp)/bytesPerSample;

        if (bytesToWriteThisIteration > ((drwav_uint64)sampleCount)*bytesPerSample) {
            bytesToWriteThisIteration = ((drwav_uint64)sampleCount)*bytesPerSample;
        }

        DRWAV_COPY_MEMORY(temp, pRunningData, (size_t)bytesToWriteThisIteration);
        drwav__bswap_samples(temp, sampleCount, bytesPerSample, pWav->translatedFormatTag);

        bytesJustWritten = drwav_write_raw(pWav, (size_t)bytesToWriteThisIteration, temp);
        if (bytesJustWritten == 0) {
            break;
        }

        bytesToWrite -= bytesJustWritten;
        bytesWritten += bytesJustWritten;
        pRunningData += bytesJustWritten;
    }

    return (bytesWritten * 8) / pWav->bitsPerSample / pWav->channels;
}